

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

bool MallocBlock::MemoryStats(int *blocks,size_t *total,int *histogram)

{
  size_t sVar1;
  FunctionRef<void_(const_void_*,_int_*)> body;
  undefined1 local_31;
  
  memset(histogram,0,0x100);
  SpinLock::Lock(&alloc_map_lock_);
  stats_blocks_ = 0;
  stats_total_ = 0;
  stats_histogram_ = histogram;
  if (alloc_map_ != (AllocMap *)0x0) {
    body.data = &local_31;
    body.fn = anon_func::anon_class_1_0_00000001::__invoke;
    AddressMap<int>::Iterate(alloc_map_,body);
  }
  sVar1 = stats_total_;
  *blocks = stats_blocks_;
  *total = sVar1;
  SpinLock::Unlock(&alloc_map_lock_);
  return true;
}

Assistant:

static bool MemoryStats(int* blocks, size_t* total,
                          int histogram[kMallocHistogramSize]) {
    memset(histogram, 0, kMallocHistogramSize * sizeof(int));
    alloc_map_lock_.Lock();
    stats_blocks_ = 0;
    stats_total_ = 0;
    stats_histogram_ = histogram;

    if (alloc_map_) {
      alloc_map_->Iterate([] (const void* ptr, int* type) {
        if ((*type & kDeallocatedTypeBit) == 0) {
          const MallocBlock* b = FromRawPointer(ptr);
          b->CheckLocked(*type);
          ++stats_blocks_;
          size_t mysize = b->size1_;
          int entry = 0;
          stats_total_ += mysize;
          while (mysize) {
            ++entry;
            mysize >>= 1;
          }
          RAW_CHECK(entry < kMallocHistogramSize,
                    "kMallocHistogramSize should be at least as large as log2 "
                    "of the maximum process memory size");
          stats_histogram_[entry] += 1;
        }
      });
    }

    *blocks = stats_blocks_;
    *total = stats_total_;
    alloc_map_lock_.Unlock();
    return true;
  }